

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_file.c
# Opt level: O0

void p2sc_write(p2sc_iofile_t *f,char *buf,gssize len)

{
  int iVar1;
  size_t in_RDX;
  char *in_RSI;
  undefined8 *in_RDI;
  GIOStatus status;
  GError *err;
  gsize count;
  undefined8 in_stack_ffffffffffffffb8;
  undefined4 uVar2;
  long local_30;
  size_t local_28;
  size_t local_20;
  char *local_18;
  undefined8 *local_10;
  
  uVar2 = (undefined4)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  if ((long)in_RDX < 0) {
    local_20 = strlen(in_RSI);
  }
  local_30 = 0;
  iVar1 = g_io_channel_write_chars(*local_10,local_18,local_20,&local_28,&local_30);
  if ((local_30 != 0) && (*(long *)(local_30 + 8) != 0)) {
    _p2sc_msg("p2sc_write",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_file.c"
              ,0xe3,"$Id: p2sc_file.c 5108 2014-06-19 12:29:23Z bogdan $",0x1068,
              "%s:%zd: error writing: %s",local_10[1],local_10[2],*(undefined8 *)(local_30 + 8));
    exit(1);
  }
  if (iVar1 != 1) {
    _p2sc_msg("p2sc_write",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_file.c"
              ,0xe9,"$Id: p2sc_file.c 5108 2014-06-19 12:29:23Z bogdan $",0x1068,
              "%s:%zd: error writing with status %d",local_10[1],local_10[2],CONCAT44(uVar2,iVar1));
    exit(1);
  }
  if (local_28 != local_20) {
    _p2sc_msg("p2sc_write",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_file.c"
              ,0xee,"$Id: p2sc_file.c 5108 2014-06-19 12:29:23Z bogdan $",0x1068,
              "%s:%zd: error writing %zd bytes: %zd written",local_10[1],local_10[2],local_28,
              local_20);
    exit(1);
  }
  return;
}

Assistant:

void p2sc_write(p2sc_iofile_t *f, const char *buf, gssize len) {
    if (len < 0)
        len = strlen(buf);

    gsize count;
    GError *err = NULL;
    GIOStatus status = g_io_channel_write_chars(f->io, buf, len, &count, &err);

    if (err && err->message) {
        P2SC_Msg(LVL_FATAL_FILESYSTEM, "%s:%zd: error writing: %s", f->name,
                 f->lineno, err->message);
        g_error_free(err);
    }

    if (status != G_IO_STATUS_NORMAL)
        P2SC_Msg(LVL_FATAL_FILESYSTEM,
                 "%s:%zd: error writing with status %d", f->name, f->lineno, (int) status);

    if (count != (gsize) len)
        P2SC_Msg(LVL_FATAL_FILESYSTEM,
                 "%s:%zd: error writing %zd bytes: %zd written", f->name,
                 f->lineno, count, (gsize) len);
}